

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O1

void __thiscall
OpticsParser::Parser::parseStringPropertyInsideBraces<std::__cxx11::string>
          (Parser *this,string *line,string *search,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *property)

{
  _Alloc_hider _Var1;
  int iVar2;
  size_type sVar3;
  void *pvVar4;
  size_type __pos;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (search,":");
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,(search->_M_dataplus)._M_p,0,search->_M_string_length);
  if (sVar3 != 0xffffffffffffffff) {
    __pos = 0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,line,sVar3 + search->_M_string_length + 1,0xffffffffffffffff);
    _Var1._M_p = local_40._M_dataplus._M_p;
    if (local_40._M_string_length != 0) {
      pvVar4 = memchr(local_40._M_dataplus._M_p,0x7d,local_40._M_string_length);
      __pos = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)_Var1._M_p;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_40,__pos,1);
    while (sVar3 = local_40._M_string_length, _Var1._M_p = local_40._M_dataplus._M_p,
          local_40._M_string_length != 0) {
      iVar2 = isspace((int)*local_40._M_dataplus._M_p);
      if (iVar2 == 0) break;
      if (sVar3 != 1) {
        if (sVar3 == 2) {
          *_Var1._M_p = _Var1._M_p[1];
        }
        else {
          memmove(_Var1._M_p,_Var1._M_p + 1,sVar3 - 1);
        }
      }
      local_40._M_dataplus._M_p[local_40._M_string_length - 1] = '\0';
      local_40._M_string_length = local_40._M_string_length - 1;
    }
    if (local_40._M_string_length != 0) {
      do {
        iVar2 = isspace((int)local_40._M_dataplus._M_p[local_40._M_string_length - 1]);
        if (iVar2 == 0) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (&local_40);
      } while (local_40._M_string_length != 0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (property,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void parseStringPropertyInsideBraces(const std::string & line,
			std::string search,
			T & property)
		{
			search += ":";
			auto itr = line.find(search);
			if(itr != std::string::npos)
			{
				std::string str = line.substr(itr + search.size() + 1);
				auto erasePos = str.find('}');
				str.erase(erasePos, 1);
				// Removes all spaces from the beginning of the string
				while(str.size() && isspace(str.front()))
					str.erase(str.begin());
				// Remove all spaces from the end of the string.
				while(str.size() && isspace(str.back()))
					str.pop_back();
				property = str;
			}
		}